

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O1

void __thiscall
CCIT<UFPC>::PerformLabelingMem
          (CCIT<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  Mat1b *pMVar6;
  long lVar7;
  bool bVar8;
  pointer puVar9;
  pointer puVar10;
  CCIT<UFPC> *pCVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  pointer piVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  pointer piVar21;
  ulong uVar22;
  undefined4 uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  pointer piVar29;
  long lVar30;
  uint j;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  pointer piVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double dVar43;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  pointer local_348;
  long local_2f8;
  undefined1 local_2c8 [104];
  Mat local_260 [16];
  long local_250;
  long *local_218;
  long local_200;
  long local_1f8;
  long local_1f0;
  undefined1 local_1e8 [104];
  Mat local_180 [16];
  long local_170;
  long *local_138;
  CCIT<UFPC> *local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  local_118 = accesses;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1e8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar22 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar22 << 0x20 | uVar22 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2c8,&local_110,0);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar6->field_0x8;
  iVar39 = *(int *)&pMVar6->field_0xc;
  UFPC::MemAlloc(((iVar39 - (iVar39 + 1 >> 0x1f)) + 1 >> 1) *
                 ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + 1);
  piVar35 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  puVar9 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  *UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  piVar29 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar10 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  UFPC::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar6->field_0xc;
  lVar26 = (long)iVar4;
  uVar5 = *(uint *)&pMVar6->field_0x8;
  piVar16 = (pointer)(ulong)uVar5;
  local_348 = piVar16;
  if (0 < lVar26) {
    iVar39 = 0;
    local_348 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    do {
      lVar33 = (long)iVar39;
      piVar1 = (int *)(local_170 + lVar33 * 4);
      *piVar1 = *piVar1 + 1;
      uVar28 = UFPC::length_;
      if (*(char *)(local_1e8._24_8_ + lVar33) == '\0') {
        iVar13 = iVar39 + 1;
        if ((iVar13 < iVar4) &&
           (piVar1 = (int *)(local_170 + 4 + lVar33 * 4), *piVar1 = *piVar1 + 1,
           uVar28 = UFPC::length_, *(char *)(local_1e8._24_8_ + 1 + lVar33) != '\0')) {
          lVar17 = (long)(int)UFPC::length_;
          piVar29[lVar17] = piVar29[lVar17] + 1;
          puVar10[lVar17] = uVar28;
          uVar28 = UFPC::length_;
        }
        else {
          if (1 < (int)uVar5) {
            lVar17 = *local_138;
            piVar1 = (int *)(lVar17 + local_170 + lVar33 * 4);
            *piVar1 = *piVar1 + 1;
            uVar28 = UFPC::length_;
            lVar19 = *(long *)local_1e8._80_8_;
            if (*(char *)(lVar33 + lVar19 + local_1e8._24_8_) != '\0') {
              lVar34 = (long)(int)UFPC::length_;
              piVar35[lVar34] = piVar35[lVar34] + 1;
              puVar9[lVar34] = uVar28;
              uVar28 = UFPC::length_;
              local_348 = (pointer)(ulong)UFPC::length_;
              UFPC::length_ = UFPC::length_ + 1;
              piVar1 = (int *)(local_250 + lVar33 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2c8._24_8_ + lVar33 * 4) = uVar28;
              if (iVar13 < iVar4) {
                piVar1 = (int *)(lVar17 + local_170 + 4 + lVar33 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar19 + local_1e8._24_8_ + 1 + lVar33);
                goto joined_r0x001cc26e;
              }
              goto LAB_001cc2df;
            }
          }
          bVar8 = false;
          if (((int)uVar5 < 2) || (iVar4 <= iVar13)) goto LAB_001cc2e2;
          piVar1 = (int *)(*local_138 + local_170 + 4 + lVar33 * 4);
          *piVar1 = *piVar1 + 1;
          uVar28 = UFPC::length_;
          if (*(char *)(lVar33 + 1 + *(long *)local_1e8._80_8_ + local_1e8._24_8_) == '\0')
          goto LAB_001cc2df;
          lVar17 = (long)(int)UFPC::length_;
          piVar35[lVar17] = piVar35[lVar17] + 1;
          puVar9[lVar17] = uVar28;
          uVar28 = UFPC::length_;
        }
        UFPC::length_ = uVar28 + 1;
        local_348 = (pointer)(ulong)uVar28;
        piVar1 = (int *)(local_250 + lVar33 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2c8._24_8_ + lVar33 * 4) = uVar28;
        bVar8 = true;
      }
      else {
        lVar17 = (long)(int)UFPC::length_;
        piVar35[lVar17] = piVar35[lVar17] + 1;
        puVar9[lVar17] = uVar28;
        uVar28 = UFPC::length_;
        local_348 = (pointer)(ulong)UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
        piVar1 = (int *)(local_250 + lVar33 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2c8._24_8_ + lVar33 * 4) = uVar28;
        if (iVar39 + 1 < iVar4) {
          piVar1 = (int *)(local_170 + 4 + lVar33 * 4);
          *piVar1 = *piVar1 + 1;
          bVar8 = true;
          if (*(char *)(local_1e8._24_8_ + 1 + lVar33) != '\0') goto LAB_001cc2e2;
          if (1 < (int)uVar5) {
            piVar1 = (int *)(*local_138 + local_170 + 4 + lVar33 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(lVar33 + 1 + *(long *)local_1e8._80_8_ + local_1e8._24_8_);
joined_r0x001cc26e:
            bVar8 = true;
            if (cVar3 != '\0') goto LAB_001cc2e2;
          }
        }
LAB_001cc2df:
        bVar8 = false;
      }
LAB_001cc2e2:
      iVar13 = iVar39 + 2;
      if ((bVar8) && (iVar13 < iVar4)) {
        lVar40 = (long)iVar13;
        lVar33 = local_170 + lVar40 * 4;
        lVar17 = local_1e8._24_8_ + lVar40;
        lVar34 = local_2c8._24_8_ + lVar40 * 4;
        lVar38 = lVar40 * 4 + local_250;
        lVar19 = 0;
        do {
          piVar1 = (int *)(lVar33 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          iVar13 = iVar39 + 3 + (int)lVar19;
          uVar23 = SUB84(local_348,0);
          if (*(char *)(lVar17 + lVar19) == '\0') {
            if ((iVar13 < iVar4) &&
               (piVar1 = (int *)(local_170 + (long)iVar13 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(local_1e8._24_8_ + (long)iVar13) != '\0')) {
              if (((int)uVar5 < 2) ||
                 (piVar1 = (int *)(*local_138 + lVar33 + lVar19 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar19 + *(long *)local_1e8._80_8_ + lVar17) == '\0')) goto LAB_001cc454;
              piVar1 = (int *)(lVar38 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar34 + lVar19 * 4) = uVar23;
            }
            else {
              if (1 < (int)uVar5) {
                lVar18 = *local_138;
                piVar1 = (int *)(lVar18 + lVar33 + lVar19 * 4);
                *piVar1 = *piVar1 + 1;
                lVar24 = *(long *)local_1e8._80_8_;
                if (*(char *)(lVar19 + lVar24 + lVar17) != '\0') {
                  piVar1 = (int *)(lVar38 + lVar19 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar34 + lVar19 * 4) = uVar23;
                  if (iVar13 < iVar4) {
                    piVar1 = (int *)(lVar18 + local_170 + (long)iVar13 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar3 = *(char *)(lVar24 + local_1e8._24_8_ + (long)iVar13);
                    goto joined_r0x001cc424;
                  }
                  goto LAB_001cc486;
                }
              }
              bVar8 = false;
              if (((int)uVar5 < 2) || (iVar4 <= iVar13)) goto LAB_001cc489;
              piVar1 = (int *)(*local_138 + local_170 + (long)iVar13 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)iVar13 + *(long *)local_1e8._80_8_ + local_1e8._24_8_) == '\0')
              goto LAB_001cc486;
LAB_001cc454:
              uVar28 = UFPC::length_;
              lVar18 = (long)(int)UFPC::length_;
              piVar35[lVar18] = piVar35[lVar18] + 1;
              puVar9[lVar18] = uVar28;
              uVar28 = UFPC::length_;
              local_348 = (pointer)(ulong)UFPC::length_;
              UFPC::length_ = UFPC::length_ + 1;
              piVar1 = (int *)(lVar38 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar34 + lVar19 * 4) = uVar28;
            }
            bVar8 = true;
          }
          else {
            piVar1 = (int *)(lVar38 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar34 + lVar19 * 4) = uVar23;
            if (iVar13 < iVar4) {
              lVar18 = (long)iVar13;
              piVar1 = (int *)(local_170 + lVar18 * 4);
              *piVar1 = *piVar1 + 1;
              bVar8 = true;
              if (*(char *)(local_1e8._24_8_ + lVar18) != '\0') goto LAB_001cc489;
              if (1 < (int)uVar5) {
                piVar1 = (int *)(*local_138 + local_170 + lVar18 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar18 + *(long *)local_1e8._80_8_ + local_1e8._24_8_);
joined_r0x001cc424:
                bVar8 = true;
                if (cVar3 != '\0') goto LAB_001cc489;
              }
            }
LAB_001cc486:
            bVar8 = false;
          }
LAB_001cc489:
          lVar18 = lVar19 + 2;
        } while ((bVar8) && (lVar24 = lVar19 + lVar40, lVar19 = lVar18, lVar24 + 2 < lVar26));
        iVar13 = (int)lVar18 + iVar39 + 2;
      }
      iVar39 = iVar13;
    } while (iVar39 < iVar4);
  }
  local_120 = this;
  if (2 < (int)uVar5) {
    piVar35 = (pointer)0x2;
    local_1f0 = 3;
    local_200 = 1;
    local_2f8 = 0;
    do {
      if (0 < iVar4) {
        lVar33 = (long)piVar35 + -1;
        lVar17 = (long)piVar35 + -2;
        piVar29 = (pointer)((ulong)piVar35 | 1);
        uVar22 = 0;
        do {
          lVar19 = *local_138;
          lVar38 = lVar19 * (long)piVar35 + local_170;
          iVar39 = (int)uVar22;
          local_1f8 = (long)iVar39;
          piVar1 = (int *)(lVar38 + local_1f8 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)local_1e8._80_8_;
          lVar40 = lVar34 * (long)piVar35 + local_1e8._24_8_;
          uVar28 = iVar39 + 1;
          if (*(char *)(local_1f8 + lVar40) == '\0') {
            if (((int)uVar28 < iVar4) &&
               (piVar1 = (int *)(lVar38 + 4 + local_1f8 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar40 + 1 + local_1f8) != '\0')) {
              lVar38 = local_170 + lVar19 * lVar33;
              piVar1 = (int *)(lVar38 + 4 + local_1f8 * 4);
              *piVar1 = *piVar1 + 1;
              lVar19 = local_1e8._24_8_ + lVar34 * lVar33;
              if (*(char *)(local_1f8 + 1 + lVar19) == '\0') {
                piVar1 = (int *)(lVar38 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar19 + local_1f8) != '\0') {
                  lVar34 = *local_218;
                  lVar18 = lVar34 * lVar17 + local_250;
                  piVar1 = (int *)(lVar18 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar40 = *(long *)local_2c8._80_8_;
                  lVar24 = lVar40 * lVar17 + local_2c8._24_8_;
                  uVar28 = *(uint *)(lVar24 + local_1f8 * 4);
                  local_348 = (pointer)(ulong)uVar28;
                  piVar1 = (int *)(lVar34 * (long)piVar35 + local_250 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(lVar40 * (long)piVar35 + local_2c8._24_8_ + local_1f8 * 4) = uVar28;
                  if ((iVar39 + 2 < iVar4) &&
                     (piVar1 = (int *)(lVar38 + 8 + local_1f8 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar19 + 2 + local_1f8) != '\0')) {
                    piVar1 = (int *)(lVar18 + 8 + local_1f8 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar28 = *(uint *)(lVar24 + 8 + local_1f8 * 4);
                    goto LAB_001ccfa1;
                  }
                  goto LAB_001ccfaa;
                }
                if ((iVar39 + 2 < iVar4) &&
                   (piVar1 = (int *)(lVar38 + 8 + local_1f8 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar19 + 2 + local_1f8) != '\0')) {
                  lVar19 = *local_218;
                  piVar1 = (int *)(lVar19 * lVar17 + local_250 + 8 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar34 = *(long *)local_2c8._80_8_;
                  uVar28 = *(uint *)(lVar34 * lVar17 + local_2c8._24_8_ + 8 + local_1f8 * 4);
                  local_348 = (pointer)(ulong)uVar28;
                  piVar1 = (int *)(lVar19 * (long)piVar35 + local_250 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(lVar34 * (long)piVar35 + local_2c8._24_8_ + local_1f8 * 4) = uVar28;
                }
                else {
LAB_001cd0fe:
                  uVar28 = UFPC::length_;
                  lVar19 = (long)(int)UFPC::length_;
                  UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar19] =
                       UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar19] + 1;
                  UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar19] = uVar28;
                  uVar28 = UFPC::length_;
                  local_348 = (pointer)(ulong)UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                  piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ +
                           local_1f8 * 4) = uVar28;
                }
LAB_001cd15d:
                bVar8 = true;
              }
              else {
                lVar19 = *local_218;
                piVar1 = (int *)(lVar19 * lVar17 + local_250 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)local_2c8._80_8_;
                uVar28 = *(uint *)(lVar34 * lVar17 + local_2c8._24_8_ + local_1f8 * 4);
                local_348 = (pointer)(ulong)uVar28;
                piVar1 = (int *)(lVar19 * (long)piVar35 + local_250 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar34 * (long)piVar35 + local_2c8._24_8_ + local_1f8 * 4) = uVar28;
                bVar8 = true;
              }
            }
            else {
              if (piVar29 < piVar16) {
                lVar38 = lVar19 * (long)piVar29 + local_170;
                piVar1 = (int *)(lVar38 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                uVar14 = UFPC::length_;
                lVar40 = lVar34 * (long)piVar29 + local_1e8._24_8_;
                if (*(char *)(local_1f8 + lVar40) != '\0') {
                  lVar19 = (long)(int)UFPC::length_;
                  UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar19] =
                       UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar19] + 1;
                  UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar19] = uVar14;
                  uVar14 = UFPC::length_;
                  local_348 = (pointer)(ulong)UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                  piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ +
                           local_1f8 * 4) = uVar14;
                  if ((int)uVar28 < iVar4) {
                    piVar1 = (int *)(lVar38 + 4 + local_1f8 * 4);
                    *piVar1 = *piVar1 + 1;
                    bVar8 = true;
                    if (*(char *)(lVar40 + 1 + local_1f8) != '\0') goto LAB_001cd160;
                  }
                  bVar8 = false;
                  goto LAB_001cd160;
                }
              }
              bVar8 = false;
              if ((piVar29 < piVar16) && ((int)uVar28 < iVar4)) {
                piVar1 = (int *)(local_170 + lVar19 * (long)piVar29 + 4 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                uVar28 = UFPC::length_;
                if (*(char *)(local_1f8 + 1 + local_1e8._24_8_ + lVar34 * (long)piVar29) != '\0') {
                  lVar19 = (long)(int)UFPC::length_;
                  UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar19] =
                       UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar19] + 1;
                  UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar19] = uVar28;
                  uVar28 = UFPC::length_;
                  local_348 = (pointer)(ulong)UFPC::length_;
                  UFPC::length_ = UFPC::length_ + 1;
                  piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ +
                           local_1f8 * 4) = uVar28;
                  goto LAB_001cd15d;
                }
                goto LAB_001ccc4c;
              }
            }
          }
          else if (((int)uVar28 < iVar4) &&
                  (piVar1 = (int *)(lVar38 + 4 + local_1f8 * 4), *piVar1 = *piVar1 + 1,
                  *(char *)(local_1f8 + 1 +
                           local_1e8._24_8_ + *(long *)local_1e8._80_8_ * (long)piVar35) != '\0')) {
            piVar1 = (int *)(*local_138 * lVar33 + local_170 + local_1f8 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1f8 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_) == '\0'
               ) {
              piVar1 = (int *)(*local_138 * lVar33 + local_170 + 4 + local_1f8 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1f8 + 1 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
                  == '\0') {
                if ((iVar39 < 2) ||
                   (piVar1 = (int *)(*local_138 * lVar33 + local_170 + -4 + local_1f8 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(local_1f8 + -1 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
                   == '\0')) {
                  if ((iVar4 <= iVar39 + 2) ||
                     (piVar1 = (int *)(*local_138 * lVar33 + local_170 + 8 + local_1f8 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)(local_1f8 + 2 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_
                              ) == '\0')) goto LAB_001cd0fe;
                  piVar1 = (int *)(*local_218 * lVar17 + local_250 + 8 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar28 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ + 8 +
                                    local_1f8 * 4);
                  local_348 = (pointer)(ulong)uVar28;
                  piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ +
                           local_1f8 * 4) = uVar28;
                  goto LAB_001cd15d;
                }
                piVar1 = (int *)(*local_218 * lVar17 + local_250 + -8 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                uVar28 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ + -8 +
                                  local_1f8 * 4);
                local_348 = (pointer)(ulong)uVar28;
                piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ +
                         local_1f8 * 4) = uVar28;
                bVar8 = true;
                if ((iVar39 + 2 < iVar4) &&
                   (piVar1 = (int *)(*local_138 * lVar33 + local_170 + 8 + uVar22 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(uVar22 + 2 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_) !=
                   '\0')) {
                  piVar1 = (int *)(*local_218 * lVar17 + local_250 + 8 + uVar22 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar28 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ + 8 +
                                    uVar22 * 4);
                  goto LAB_001ccfa1;
                }
              }
              else {
                piVar1 = (int *)(*local_218 * lVar17 + local_250 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                uVar28 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ +
                                  local_1f8 * 4);
                local_348 = (pointer)(ulong)uVar28;
                piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ +
                         local_1f8 * 4) = uVar28;
                bVar8 = true;
                if ((1 < iVar39) &&
                   (piVar1 = (int *)(*local_138 * lVar33 + local_170 + -4 + local_1f8 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(local_1f8 + -1 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
                   != '\0')) {
                  piVar1 = (int *)(*local_218 * lVar17 + local_250 + -8 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar28 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ + -8 +
                                    local_1f8 * 4);
                  goto LAB_001ccfa1;
                }
              }
            }
            else {
              piVar1 = (int *)(*local_218 * lVar17 + local_250 + local_1f8 * 4);
              *piVar1 = *piVar1 + 1;
              uVar28 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ +
                                local_1f8 * 4);
              local_348 = (pointer)(ulong)uVar28;
              piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ + local_1f8 * 4
                       ) = uVar28;
              piVar1 = (int *)(*local_138 * lVar33 + local_170 + 4 + local_1f8 * 4);
              *piVar1 = *piVar1 + 1;
              bVar8 = true;
              if (((*(char *)(local_1f8 + 1 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
                    == '\0') && (iVar39 + 2 < iVar4)) &&
                 (piVar1 = (int *)(*local_138 * lVar33 + local_170 + 8 + local_1f8 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(local_1f8 + 2 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_) !=
                 '\0')) {
                piVar1 = (int *)(*local_218 * lVar17 + local_250 + 8 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                uVar28 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ + 8 +
                                  local_1f8 * 4);
LAB_001ccfa1:
                UFPC::MemMerge((uint)local_348,uVar28);
LAB_001ccfaa:
                bVar8 = true;
              }
            }
          }
          else {
            piVar1 = (int *)(*local_138 * lVar33 + local_170 + local_1f8 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1f8 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_) == '\0'
               ) {
              if ((iVar39 < 2) ||
                 (piVar1 = (int *)(*local_138 * lVar33 + local_170 + -4 + local_1f8 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(local_1f8 + -1 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
                 == '\0')) {
                if (((int)uVar28 < iVar4) &&
                   (piVar1 = (int *)(*local_138 * lVar33 + local_170 + 4 + local_1f8 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(local_1f8 + 1 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
                   != '\0')) goto LAB_001cc773;
                uVar14 = UFPC::length_;
                lVar19 = (long)(int)UFPC::length_;
                UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar19] =
                     UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar19] + 1;
                UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar19] = uVar14;
                uVar14 = UFPC::length_;
                local_348 = (pointer)(ulong)UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
                piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ +
                         local_1f8 * 4) = uVar14;
              }
              else {
                piVar1 = (int *)(*local_218 * lVar17 + local_250 + -8 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                uVar14 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ + -8 +
                                  local_1f8 * 4);
                local_348 = (pointer)(ulong)uVar14;
                piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ +
                         local_1f8 * 4) = uVar14;
                if (((int)uVar28 < iVar4) &&
                   (piVar1 = (int *)(*local_138 * lVar33 + local_170 + (ulong)uVar28 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)((ulong)uVar28 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
                   != '\0')) {
                  piVar1 = (int *)(*local_218 * lVar17 + local_250 + local_1f8 * 4);
                  *piVar1 = *piVar1 + 1;
                  UFPC::MemMerge(uVar14,*(uint *)(*(long *)local_2c8._80_8_ * lVar17 +
                                                  local_2c8._24_8_ + local_1f8 * 4));
                }
              }
            }
            else {
LAB_001cc773:
              piVar1 = (int *)(*local_218 * lVar17 + local_250 + local_1f8 * 4);
              *piVar1 = *piVar1 + 1;
              uVar14 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ +
                                local_1f8 * 4);
              local_348 = (pointer)(ulong)uVar14;
              piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + local_1f8 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ + local_1f8 * 4
                       ) = uVar14;
            }
            if (((int)uVar28 < iVar4) && (piVar29 < piVar16)) {
              piVar1 = (int *)(*local_138 * (long)piVar29 + local_170 + 4 + local_1f8 * 4);
              *piVar1 = *piVar1 + 1;
              bVar8 = true;
              if (*(char *)(local_1f8 + 1 +
                           *(long *)local_1e8._80_8_ * (long)piVar29 + local_1e8._24_8_) != '\0')
              goto LAB_001cd160;
            }
LAB_001ccc4c:
            bVar8 = false;
          }
LAB_001cd160:
          uVar28 = iVar39 + 2;
          if ((bVar8) && ((int)uVar28 < iVar4)) {
            lVar38 = (long)(int)uVar28;
            lVar19 = lVar38 * 4;
            lVar34 = 0;
            do {
              lVar40 = *local_138;
              lVar31 = lVar40 * (long)piVar35 + local_170;
              piVar1 = (int *)(lVar31 + lVar19 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)local_1e8._80_8_;
              lVar24 = lVar18 * (long)piVar35 + local_1e8._24_8_;
              uVar25 = uVar22 + 3 + lVar34;
              iVar15 = (int)uVar25;
              iVar13 = (int)lVar34;
              uVar28 = (uint)local_348;
              if (*(char *)(lVar34 + lVar24 + lVar38) == '\0') {
                if (iVar15 < iVar4) {
                  lVar42 = (long)iVar15;
                  piVar1 = (int *)(lVar31 + lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar24 + lVar42) == '\0') goto LAB_001cd538;
                  if (piVar29 < piVar16) {
                    piVar1 = (int *)(local_1f0 * lVar40 + local_170 + lVar19 + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar34 + local_1f0 * lVar18 + local_1e8._24_8_ + lVar38) == '\0')
                    goto LAB_001cd761;
                    lVar31 = *local_218;
                    lVar24 = local_250 + lVar19;
                    piVar1 = (int *)((long)piVar35 * lVar31 + lVar24 + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar7 = *(long *)local_2c8._80_8_;
                    lVar36 = lVar19 + local_2c8._24_8_;
                    *(uint *)((long)piVar35 * lVar7 + lVar36 + lVar34 * 4) = uVar28;
                    lVar37 = local_170 + lVar40 * lVar33;
                    piVar1 = (int *)(lVar37 + lVar42 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar30 = local_1e8._24_8_ + lVar18 * lVar33;
                    if (*(char *)(lVar42 + lVar30) == '\0') {
                      piVar1 = (int *)(local_170 + lVar19 + lVar40 * local_200 + lVar34 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar34 + local_1e8._24_8_ + lVar38 + lVar18 * local_200) != '\0'
                         ) {
                        iVar15 = iVar39 + iVar13 + 4;
                        if (iVar15 < iVar4) {
                          lVar40 = (long)iVar15;
                          piVar1 = (int *)(lVar37 + lVar40 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar30 + lVar40) != '\0') {
                            piVar1 = (int *)(lVar24 + local_2f8 * lVar31 + lVar34 * 4);
                            *piVar1 = *piVar1 + 1;
                            uVar14 = *(uint *)(lVar36 + local_2f8 * lVar7 + lVar34 * 4);
                            piVar1 = (int *)(local_250 + lVar31 * lVar17 + lVar40 * 4);
                            *piVar1 = *piVar1 + 1;
                            uVar14 = UFPC::MemMerge(uVar14,*(uint *)(local_2c8._24_8_ +
                                                                     lVar7 * lVar17 + lVar40 * 4));
                            goto LAB_001cdd31;
                          }
                        }
                        piVar1 = (int *)(lVar24 + lVar31 * local_2f8 + lVar34 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar14 = *(uint *)(lVar36 + lVar7 * local_2f8 + lVar34 * 4);
                        goto LAB_001cdd31;
                      }
                    }
                    else {
                      piVar1 = (int *)(lVar24 + lVar31 * local_2f8 + lVar34 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar14 = *(uint *)(lVar36 + lVar7 * local_2f8 + lVar34 * 4);
LAB_001cdd31:
                      UFPC::MemMerge(uVar28,uVar14);
                    }
                    iVar13 = iVar39 + iVar13 + 4;
                    if (iVar13 < iVar4) {
                      lVar40 = (long)iVar13;
                      piVar1 = (int *)(*local_138 * lVar33 + local_170 + lVar40 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar40 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
                          == '\0') goto LAB_001cddd9;
                      piVar1 = (int *)(*local_218 * lVar17 + local_250 + lVar40 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar28 = *(uint *)(*(long *)local_2c8._80_8_ * lVar17 + local_2c8._24_8_ +
                                        lVar40 * 4);
LAB_001cddcb:
                      UFPC::MemMerge((uint)local_348,uVar28);
                    }
LAB_001cddd9:
                    bVar8 = true;
                  }
                  else {
LAB_001cd761:
                    lVar31 = lVar40 * lVar33 + local_170;
                    piVar1 = (int *)(lVar31 + lVar42 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar24 = lVar18 * lVar33 + local_1e8._24_8_;
                    if (*(char *)(lVar42 + lVar24) != '\0') {
                      lVar40 = *local_218;
                      piVar1 = (int *)(local_2f8 * lVar40 + local_250 + lVar19 + lVar34 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar18 = *(long *)local_2c8._80_8_;
                      uVar28 = *(uint *)(local_2f8 * lVar18 + local_2c8._24_8_ + lVar19 + lVar34 * 4
                                        );
                      local_348 = (pointer)(ulong)uVar28;
                      piVar1 = (int *)(lVar40 * (long)piVar35 + local_250 + lVar19 + lVar34 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(uint *)(lVar18 * (long)piVar35 + local_2c8._24_8_ + lVar19 + lVar34 * 4) =
                           uVar28;
                      bVar8 = true;
                      goto LAB_001cd8c9;
                    }
                    piVar1 = (int *)(local_170 + lVar19 + lVar40 * local_200 + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar34 + local_1e8._24_8_ + lVar38 + lVar18 * local_200) != '\0')
                    {
                      lVar40 = *local_218;
                      piVar1 = (int *)(local_2f8 * lVar40 + local_250 + lVar19 + lVar34 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar18 = *(long *)local_2c8._80_8_;
                      uVar28 = *(uint *)(local_2f8 * lVar18 + local_2c8._24_8_ + lVar19 + lVar34 * 4
                                        );
                      local_348 = (pointer)(ulong)uVar28;
                      piVar1 = (int *)((long)piVar35 * lVar40 + local_250 + lVar19 + lVar34 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(uint *)((long)piVar35 * lVar18 + local_2c8._24_8_ + lVar19 + lVar34 * 4) =
                           uVar28;
                      iVar13 = iVar39 + iVar13 + 4;
                      bVar8 = true;
                      if (iVar13 < iVar4) {
                        lVar42 = (long)iVar13;
                        piVar1 = (int *)(lVar31 + lVar42 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar24 + lVar42) != '\0') {
                          piVar1 = (int *)(local_250 + lVar40 * lVar17 + lVar42 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar28 = *(uint *)(local_2c8._24_8_ + lVar18 * lVar17 + lVar42 * 4);
                          goto LAB_001cddcb;
                        }
                      }
                      goto LAB_001cd8c9;
                    }
                    iVar13 = iVar39 + iVar13 + 4;
                    if (iVar4 <= iVar13) {
LAB_001cdc77:
                      uVar28 = UFPC::length_;
                      lVar40 = (long)(int)UFPC::length_;
                      UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar40] =
                           UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar40] + 1;
                      UFPC::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar40] = uVar28;
                      uVar28 = UFPC::length_;
                      UFPC::length_ = UFPC::length_ + 1;
                      piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + lVar19 + lVar34 * 4)
                      ;
                      *piVar1 = *piVar1 + 1;
                      lVar40 = *(long *)local_2c8._80_8_;
                      goto LAB_001cd684;
                    }
                    lVar40 = (long)iVar13;
                    piVar1 = (int *)(lVar31 + lVar40 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar24 + lVar40) == '\0') goto LAB_001cdc77;
                    lVar18 = *local_218;
                    piVar1 = (int *)(lVar18 * lVar17 + local_250 + lVar40 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar24 = *(long *)local_2c8._80_8_;
                    uVar28 = *(uint *)(lVar24 * lVar17 + local_2c8._24_8_ + lVar40 * 4);
                    piVar1 = (int *)(local_250 + lVar19 + lVar18 * (long)piVar35 + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(local_2c8._24_8_ + lVar19 + lVar24 * (long)piVar35 + lVar34 * 4) =
                         uVar28;
LAB_001cd68c:
                    local_348 = (pointer)(ulong)uVar28;
                    bVar8 = true;
                  }
                }
                else {
LAB_001cd538:
                  if ((piVar29 < piVar16) &&
                     (piVar1 = (int *)(local_1f0 * lVar40 + lVar19 + local_170 + lVar34 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)(lVar34 + local_1f0 * lVar18 + local_1e8._24_8_ + lVar38) != '\0')) {
                    piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + lVar19 + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ + lVar19
                             + lVar34 * 4) = uVar28;
                    if (iVar15 < iVar4) {
                      piVar1 = (int *)(local_170 + lVar40 * (long)piVar29 + (long)iVar15 * 4);
                      *piVar1 = *piVar1 + 1;
                      bVar8 = true;
                      if (*(char *)(local_1e8._24_8_ + lVar18 * (long)piVar29 + (long)iVar15) !=
                          '\0') goto LAB_001cd8c9;
                    }
                  }
                  else {
                    bVar8 = false;
                    if ((piVar16 <= piVar29) || (iVar4 <= iVar15)) goto LAB_001cd8c9;
                    piVar1 = (int *)(local_170 + lVar40 * (long)piVar29 + (long)iVar15 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar28 = UFPC::length_;
                    if (*(char *)((long)iVar15 + local_1e8._24_8_ + lVar18 * (long)piVar29) != '\0')
                    {
                      lVar40 = (long)(int)UFPC::length_;
                      UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar40] =
                           UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar40] + 1;
                      UFPC::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar40] = uVar28;
                      uVar28 = UFPC::length_;
                      UFPC::length_ = UFPC::length_ + 1;
                      piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + lVar19 + lVar34 * 4)
                      ;
                      *piVar1 = *piVar1 + 1;
                      lVar40 = *(long *)local_2c8._80_8_;
LAB_001cd684:
                      *(uint *)(lVar40 * (long)piVar35 + local_2c8._24_8_ + lVar19 + lVar34 * 4) =
                           uVar28;
                      goto LAB_001cd68c;
                    }
                  }
                  bVar8 = false;
                }
              }
              else {
                uVar2 = uVar22 + lVar34;
                lVar42 = *local_218;
                lVar41 = lVar19 + local_250;
                lVar30 = (long)piVar35 * lVar42 + lVar41;
                piVar1 = (int *)(lVar30 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                lVar7 = *(long *)local_2c8._80_8_;
                lVar36 = local_2c8._24_8_ + lVar19;
                lVar37 = (long)piVar35 * lVar7 + lVar36;
                *(uint *)(lVar37 + lVar34 * 4) = uVar28;
                iVar32 = (int)uVar2;
                if (iVar15 < iVar4) {
                  lVar27 = (long)iVar15;
                  piVar1 = (int *)(lVar31 + lVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar24 + lVar27) != '\0') {
                    lVar24 = lVar40 * lVar33 + local_170;
                    piVar1 = (int *)(local_170 + lVar19 + local_200 * lVar40 + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar40 = lVar18 * lVar33 + local_1e8._24_8_;
                    cVar3 = *(char *)(lVar34 + local_1e8._24_8_ + lVar38 + local_200 * lVar18);
                    piVar1 = (int *)(lVar24 + lVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (cVar3 == '\0') {
                      if (*(char *)(lVar27 + lVar40) != '\0') {
                        if ((-1 < iVar32) &&
                           (uVar25 = (ulong)(iVar39 + iVar13 + 1),
                           piVar1 = (int *)(lVar24 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                           *(char *)(lVar40 + uVar25) != '\0')) {
                          lVar40 = (uVar2 & 0xffffffff) * 4;
                          piVar1 = (int *)(lVar40 + local_250 + lVar42 * lVar17);
                          *piVar1 = *piVar1 + 1;
                          uVar14 = *(uint *)(lVar40 + local_2c8._24_8_ + lVar7 * lVar17);
                          piVar1 = (int *)(lVar41 + local_2f8 * lVar42 + lVar34 * 4);
                          *piVar1 = *piVar1 + 1;
                          j = *(uint *)(lVar36 + local_2f8 * lVar7 + lVar34 * 4);
                          goto LAB_001cd881;
                        }
                        goto LAB_001cd88e;
                      }
                      if ((-1 < iVar32) &&
                         (uVar25 = (ulong)(iVar39 + iVar13 + 1),
                         piVar1 = (int *)(lVar24 + uVar25 * 4), *piVar1 = *piVar1 + 1,
                         *(char *)(lVar40 + uVar25) != '\0')) {
                        uVar25 = uVar22 + lVar34 + 4;
                        if ((int)uVar25 < iVar4) {
                          uVar25 = uVar25 & 0xffffffff;
                          piVar1 = (int *)(lVar24 + uVar25 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar40 + uVar25) != '\0') {
                            lVar24 = local_250 + lVar42 * lVar17;
                            lVar40 = (uVar2 & 0xffffffff) * 4;
                            piVar1 = (int *)(lVar40 + lVar24);
                            *piVar1 = *piVar1 + 1;
                            lVar18 = local_2c8._24_8_ + lVar7 * lVar17;
                            uVar14 = *(uint *)(lVar40 + lVar18);
                            piVar1 = (int *)(lVar24 + uVar25 * 4);
                            *piVar1 = *piVar1 + 1;
                            j = *(uint *)(lVar18 + uVar25 * 4);
                            goto LAB_001cd881;
                          }
                        }
                        lVar40 = (uVar2 & 0xffffffff) * 4;
                        piVar1 = (int *)(lVar40 + local_250 + lVar42 * lVar17);
                        *piVar1 = *piVar1 + 1;
                        uVar14 = *(uint *)(lVar40 + local_2c8._24_8_ + lVar7 * lVar17);
                        goto LAB_001cd8b7;
                      }
                      iVar13 = iVar39 + iVar13 + 4;
                      bVar8 = true;
                      if (iVar13 < iVar4) {
                        lVar18 = (long)iVar13;
                        piVar1 = (int *)(lVar24 + lVar18 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar40 + lVar18) != '\0') {
                          piVar1 = (int *)(local_250 + lVar42 * lVar17 + lVar18 * 4);
                          *piVar1 = *piVar1 + 1;
                          UFPC::MemMerge(uVar28,*(uint *)(local_2c8._24_8_ + lVar7 * lVar17 +
                                                         lVar18 * 4));
                        }
                      }
                    }
                    else {
                      if ((*(char *)(lVar27 + lVar40) == '\0') &&
                         (iVar13 = iVar39 + iVar13 + 4, iVar13 < iVar4)) {
                        lVar18 = (long)iVar13;
                        piVar1 = (int *)(lVar24 + lVar18 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar40 + lVar18) == '\0') goto LAB_001cd88e;
                        piVar1 = (int *)(lVar41 + local_2f8 * lVar42 + lVar34 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar14 = *(uint *)(lVar36 + local_2f8 * lVar7 + lVar34 * 4);
                        piVar1 = (int *)(local_250 + lVar42 * lVar17 + lVar18 * 4);
                        *piVar1 = *piVar1 + 1;
                        j = *(uint *)(local_2c8._24_8_ + lVar7 * lVar17 + lVar18 * 4);
LAB_001cd881:
                        uVar14 = UFPC::MemMerge(uVar14,j);
                      }
                      else {
LAB_001cd88e:
                        piVar1 = (int *)(lVar41 + lVar42 * local_2f8 + lVar34 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar14 = *(uint *)(lVar36 + lVar7 * local_2f8 + lVar34 * 4);
                      }
LAB_001cd8b7:
                      UFPC::MemMerge(uVar28,uVar14);
                      bVar8 = true;
                    }
                    goto LAB_001cd8c9;
                  }
                }
                piVar1 = (int *)(lVar30 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar37 + lVar34 * 4) = uVar28;
                piVar1 = (int *)(local_200 * lVar40 + lVar19 + local_170 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar34 + local_200 * lVar18 + local_1e8._24_8_ + lVar38) == '\0') {
                  lVar24 = local_170 + lVar40 * lVar33;
                  lVar40 = local_1e8._24_8_ + lVar18 * lVar33;
                  if ((-1 < iVar32) &&
                     (uVar20 = (ulong)(iVar39 + iVar13 + 1), piVar1 = (int *)(lVar24 + uVar20 * 4),
                     *piVar1 = *piVar1 + 1, *(char *)(lVar40 + uVar20) != '\0')) {
                    if ((iVar15 < iVar4) &&
                       (uVar25 = uVar25 & 0xffffffff, piVar1 = (int *)(lVar24 + uVar25 * 4),
                       *piVar1 = *piVar1 + 1, *(char *)(lVar40 + uVar25) != '\0')) {
                      lVar40 = (uVar2 & 0xffffffff) * 4;
                      piVar1 = (int *)(lVar40 + local_250 + lVar42 * lVar17);
                      *piVar1 = *piVar1 + 1;
                      uVar14 = *(uint *)(lVar40 + local_2c8._24_8_ + lVar7 * lVar17);
                      piVar1 = (int *)(lVar41 + local_2f8 * lVar42 + lVar34 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar14 = UFPC::MemMerge(uVar14,*(uint *)(lVar36 + local_2f8 * lVar7 +
                                                              lVar34 * 4));
                    }
                    else {
                      lVar40 = (uVar2 & 0xffffffff) * 4;
                      piVar1 = (int *)(lVar40 + local_250 + lVar42 * lVar17);
                      *piVar1 = *piVar1 + 1;
                      uVar14 = *(uint *)(lVar40 + local_2c8._24_8_ + lVar7 * lVar17);
                    }
                    goto LAB_001cd3c2;
                  }
                  if (iVar15 < iVar4) {
                    piVar1 = (int *)(lVar24 + (long)iVar15 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar40 + iVar15) != '\0') {
                      piVar1 = (int *)(lVar41 + lVar42 * local_2f8 + lVar34 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar14 = *(uint *)(lVar36 + lVar7 * local_2f8 + lVar34 * 4);
                      goto LAB_001cd3c2;
                    }
                    goto LAB_001cd3cb;
                  }
                }
                else {
                  piVar1 = (int *)(lVar41 + lVar42 * local_2f8 + lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar14 = *(uint *)(lVar36 + lVar7 * local_2f8 + lVar34 * 4);
LAB_001cd3c2:
                  UFPC::MemMerge(uVar28,uVar14);
LAB_001cd3cb:
                  if ((iVar15 < iVar4) && (piVar29 < piVar16)) {
                    piVar1 = (int *)(*local_138 * (long)piVar29 + local_170 + (long)iVar15 * 4);
                    *piVar1 = *piVar1 + 1;
                    bVar8 = true;
                    if (*(char *)((long)iVar15 +
                                 *(long *)local_1e8._80_8_ * (long)piVar29 + local_1e8._24_8_) !=
                        '\0') goto LAB_001cd8c9;
                  }
                }
                bVar8 = false;
              }
LAB_001cd8c9:
              lVar40 = lVar34 + 2;
            } while ((bVar8) && (lVar18 = lVar34 + lVar38, lVar34 = lVar40, lVar18 + 2 < lVar26));
            uVar28 = (int)lVar40 + (int)local_1f8 + 2;
          }
          uVar22 = (ulong)uVar28;
        } while ((int)uVar28 < iVar4);
      }
      piVar35 = (pointer)((long)piVar35 + 2);
      local_1f0 = local_1f0 + 2;
      local_200 = local_200 + 2;
      local_2f8 = local_2f8 + 2;
    } while (piVar35 < piVar16);
  }
  uVar28 = UFPC::MemFlatten();
  (local_120->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar28;
  if (0 < (int)uVar5) {
    lVar33 = 1;
    piVar35 = (pointer)0x0;
    do {
      piVar29 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar9 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar4) {
        piVar21 = (pointer)((ulong)piVar35 | 1);
        lVar17 = *(long *)local_2c8._80_8_;
        lVar19 = *local_218;
        lVar34 = 1;
        do {
          piVar1 = (int *)(lVar19 * (long)piVar35 + local_250 + -4 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = (long)*(int *)(lVar17 * (long)piVar35 + local_2c8._24_8_ + -4 + lVar34 * 4);
          if (lVar38 < 1) {
            piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + -4 + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)
             (*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ + -4 + lVar34 * 4) = 0;
            if (lVar34 < lVar26) {
              piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)
               (*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ + lVar34 * 4) = 0;
              if (piVar21 < piVar16) {
                piVar1 = (int *)(*local_218 * lVar33 + local_250 + -4 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)
                 (*(long *)local_2c8._80_8_ * lVar33 + local_2c8._24_8_ + -4 + lVar34 * 4) = 0;
                piVar1 = (int *)(*local_218 * lVar33 + local_250 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(*(long *)local_2c8._80_8_ * lVar33 + local_2c8._24_8_ + lVar34 * 4)
                     = 0;
              }
            }
            else if (piVar21 < piVar16) {
              piVar1 = (int *)(*local_218 * lVar33 + local_250 + -4 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              lVar38 = *(long *)local_2c8._80_8_ * lVar33 + local_2c8._24_8_;
LAB_001ce1a3:
              *(undefined4 *)(lVar38 + -4 + lVar34 * 4) = 0;
            }
          }
          else {
            piVar29[lVar38] = piVar29[lVar38] + 1;
            uVar5 = puVar9[lVar38];
            piVar1 = (int *)(*local_138 * (long)piVar35 + local_170 + -4 + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            uVar28 = uVar5;
            if (*(char *)(lVar34 + -1 + *(long *)local_1e8._80_8_ * (long)piVar35 + local_1e8._24_8_
                         ) == '\0') {
              uVar28 = 0;
            }
            piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + -4 + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ + -4 + lVar34 * 4
                     ) = uVar28;
            if (lVar34 < lVar26) {
              piVar1 = (int *)(*local_138 * (long)piVar35 + local_170 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              uVar28 = uVar5;
              if (*(char *)(lVar34 + *(long *)local_1e8._80_8_ * (long)piVar35 + local_1e8._24_8_)
                  == '\0') {
                uVar28 = 0;
              }
              piVar1 = (int *)(*local_218 * (long)piVar35 + local_250 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2c8._80_8_ * (long)piVar35 + local_2c8._24_8_ + lVar34 * 4) =
                   uVar28;
              if (piVar21 < piVar16) {
                piVar1 = (int *)(*local_138 * lVar33 + local_170 + -4 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                uVar28 = uVar5;
                if (*(char *)(lVar34 + -1 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
                    == '\0') {
                  uVar28 = 0;
                }
                piVar1 = (int *)(*local_218 * lVar33 + local_250 + -4 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2c8._80_8_ * lVar33 + local_2c8._24_8_ + -4 + lVar34 * 4) =
                     uVar28;
                piVar1 = (int *)(*local_138 * lVar33 + local_170 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar34 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_);
                piVar1 = (int *)(*local_218 * lVar33 + local_250 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_2c8._80_8_ * lVar33 + local_2c8._24_8_;
                if (cVar3 == '\0') {
                  *(undefined4 *)(lVar38 + lVar34 * 4) = 0;
                }
                else {
                  *(uint *)(lVar38 + lVar34 * 4) = uVar5;
                }
              }
            }
            else if (piVar21 < piVar16) {
              piVar1 = (int *)(*local_138 * lVar33 + local_170 + -4 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(lVar34 + -1 + *(long *)local_1e8._80_8_ * lVar33 + local_1e8._24_8_)
              ;
              piVar1 = (int *)(*local_218 * lVar33 + local_250 + -4 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              lVar38 = *(long *)local_2c8._80_8_ * lVar33 + local_2c8._24_8_;
              if (cVar3 == '\0') goto LAB_001ce1a3;
              *(uint *)(lVar38 + -4 + lVar34 * 4) = uVar5;
            }
          }
          lVar38 = lVar34 + 1;
          lVar34 = lVar34 + 2;
        } while (lVar38 < lVar26);
      }
      piVar35 = (pointer)((long)piVar35 + 2);
      lVar33 = lVar33 + 2;
    } while (piVar35 < piVar16);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_118,local_108);
  pCVar11 = local_120;
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_180;
  cv::sum((_InputArray *)local_108);
  pvVar12 = local_118;
  *(local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_260;
  cv::sum((_InputArray *)local_108);
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  if ((long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar22 = 0;
  }
  else {
    lVar26 = (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar43 = 0.0;
    lVar33 = 0;
    do {
      dVar43 = dVar43 + (double)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar33];
      lVar33 = lVar33 + 1;
    } while (lVar26 + (ulong)(lVar26 == 0) != lVar33);
    uVar22 = (long)(dVar43 - 9.223372036854776e+18) & (long)dVar43 >> 0x3f | (long)dVar43;
  }
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] = uVar22;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_2c8);
  cv::Mat::operator=(&((pCVar11->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                     ,(Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_260);
  cv::Mat::~Mat((Mat *)(local_2c8 + 8));
  cv::Mat::~Mat(local_180);
  cv::Mat::~Mat((Mat *)(local_1e8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

        int lx, u, v, k;

#define CONDITION_B1 img(y, x) > 0 
#define CONDITION_B2 x+1<w && img(y, x+1) > 0                // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img(y + 1, x) > 0              // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img(y + 1, x + 1) > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img(y - 1, x - 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U2 img(y - 1, x) > 0
#define CONDITION_U3 x+1<w && img(y - 1, x + 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img(y - 1, x + 2) > 0          // WRONG in the original code -> add missing condition
#define ASSIGN_S  img_labels(y, x) = img_labels(y, x - 2)
#define ASSIGN_P  img_labels(y, x) = img_labels(y - 2, x - 2)
#define ASSIGN_Q  img_labels(y, x) = img_labels(y - 2, x)
#define ASSIGN_R  img_labels(y, x) = img_labels(y - 2, x + 2)
#define ASSIGN_LX img_labels(y, x) = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels(y - 2, x-2)
#define LOAD_PV v = img_labels(y - 2, x-2)
#define LOAD_QU u = img_labels(y - 2, x)
#define LOAD_QV v = img_labels(y - 2, x)
#define LOAD_QK k = img_labels(y - 2, x)
#define LOAD_RV v = img_labels(y - 2, x+2)
#define LOAD_RK k = img_labels(y - 2, x+2)
#define NEW_LABEL lx = img_labels(y, x) = LabelsSolver::MemNewLabel();
#define RESOLVE_2(u, v) LabelsSolver::MemMerge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::MemMerge(u,LabelsSolver::MemMerge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }